

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interval_column_reader.hpp
# Opt level: O2

interval_t
duckdb::IntervalValueConversion::PlainRead<true>(ByteBuffer *plain_data,ColumnReader *reader)

{
  data_ptr_t pdVar1;
  undefined8 uVar2;
  interval_t iVar3;
  
  ByteBuffer::available(plain_data,0xc);
  pdVar1 = plain_data->ptr;
  uVar2 = *(undefined8 *)pdVar1;
  iVar3.micros = (ulong)*(uint *)(pdVar1 + 8) * 1000;
  plain_data->len = plain_data->len - 0xc;
  plain_data->ptr = pdVar1 + 0xc;
  iVar3._0_8_ = uVar2;
  return iVar3;
}

Assistant:

static interval_t PlainRead(ByteBuffer &plain_data, ColumnReader &reader) {
		if (CHECKED) {
			plain_data.available(PARQUET_INTERVAL_SIZE);
		}
		auto res = ReadParquetInterval(const_data_ptr_cast(plain_data.ptr));
		plain_data.unsafe_inc(PARQUET_INTERVAL_SIZE);
		return res;
	}